

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_reg_rd(void *ctx,MppDevRegRdCfg *cfg)

{
  MppReqV1 *pMVar1;
  MppReqV1 *mpp_req;
  MppDevMppService *p;
  MppDevRegRdCfg *cfg_local;
  void *ctx_local;
  
  pMVar1 = mpp_service_next_req((MppDevMppService *)ctx);
  pMVar1->cmd = 0x201;
  pMVar1->flag = 0;
  pMVar1->size = cfg->size;
  pMVar1->offset = cfg->offset;
  pMVar1->data_ptr = (RK_U64)cfg->reg;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_service_reg_rd(void *ctx, MppDevRegRdCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    MppReqV1 *mpp_req = mpp_service_next_req(p);

    mpp_req->cmd = MPP_CMD_SET_REG_READ;
    mpp_req->flag = 0;
    mpp_req->size = cfg->size;
    mpp_req->offset = cfg->offset;
    mpp_req->data_ptr = REQ_DATA_PTR(cfg->reg);

    return MPP_OK;
}